

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demux.c
# Opt level: O0

WebPEncodingError
SetFrame(WebPAnimEncoder *enc,WebPConfig *config,int is_key_frame,EncodedFrame *encoded_frame,
        int *frame_skipped)

{
  int iVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  void *__dest;
  int in_EDX;
  int *in_RSI;
  long in_RDI;
  undefined4 *in_R8;
  WebPPicture *prev_canvas_disposed;
  WebPConfig config_lossy;
  WebPConfig config_ll;
  SubFrameParams dispose_bg_params;
  SubFrameParams dispose_none_params;
  int dispose_bg_possible;
  int empty_rect_allowed_bg;
  int empty_rect_allowed_none;
  int is_first_frame;
  int consider_lossy;
  int consider_lossless;
  int is_lossless;
  Candidate candidates [4];
  WebPPicture *prev_canvas;
  WebPPicture *curr_canvas;
  WebPEncodingError error_code;
  int i;
  SubFrameParams *in_stack_fffffffffffff888;
  WebPPicture *in_stack_fffffffffffff890;
  SubFrameParams *in_stack_fffffffffffff898;
  float in_stack_fffffffffffff8a4;
  undefined5 in_stack_fffffffffffff8b0;
  byte bVar4;
  undefined1 uVar5;
  undefined1 uVar6;
  WebPPicture *in_stack_fffffffffffff8b8;
  undefined4 local_740;
  int in_stack_fffffffffffff8c4;
  Candidate *in_stack_fffffffffffff8c8;
  WebPAnimEncoder *in_stack_fffffffffffff8d0;
  SubFrameParams *in_stack_fffffffffffff8e8;
  int in_stack_fffffffffffff8f4;
  int in_stack_fffffffffffff8f8;
  WebPMuxAnimDispose in_stack_fffffffffffff8fc;
  Candidate *in_stack_fffffffffffff900;
  WebPAnimEncoder *in_stack_fffffffffffff908;
  WebPConfig *in_stack_fffffffffffff920;
  WebPConfig *in_stack_fffffffffffff928;
  undefined4 local_6cc [29];
  int local_658;
  FrameRectangle aFStack_650 [17];
  FrameRectangle aFStack_540 [17];
  int local_430;
  FrameRectangle aFStack_428 [17];
  FrameRectangle aFStack_318 [17];
  uint local_204;
  undefined4 local_200;
  uint local_1fc;
  int local_1f8;
  uint local_1f4;
  uint local_1f0;
  int local_1ec;
  undefined1 local_1e8 [96];
  int aiStack_188 [80];
  long local_48;
  long local_40;
  WebPEncodingError local_38;
  int local_34;
  undefined4 *local_30;
  int *local_18;
  long local_10;
  
  local_38 = VP8_ENC_OK;
  local_40 = in_RDI + 0x138;
  local_48 = in_RDI + 0x240;
  local_1ec = *in_RSI;
  uVar6 = true;
  if (local_1ec == 0) {
    uVar6 = *(int *)(in_RDI + 0x1c) != 0;
  }
  local_1f0 = (uint)(byte)uVar6;
  uVar5 = true;
  if (local_1ec != 0) {
    uVar5 = *(int *)(in_RDI + 0x1c) != 0;
  }
  local_1f4 = (uint)(byte)uVar5;
  local_1f8 = *(int *)(in_RDI + 0x484);
  local_1fc = (uint)((local_1f8 != 0 ^ 0xffU) & 1);
  local_200 = 0;
  bVar4 = 0;
  if (in_EDX == 0) {
    bVar4 = *(int *)(in_RDI + 0x480) != 0 ^ 0xff;
  }
  local_204 = (uint)(bVar4 & 1);
  local_30 = in_R8;
  local_18 = in_RSI;
  local_10 = in_RDI;
  memcpy(local_6cc,in_RSI,0x74);
  memcpy(&local_740,local_18,0x74);
  local_6cc[0] = 1;
  local_740 = 0;
  memcpy((void *)(local_10 + 0x44),local_18,0x74);
  __dest = (void *)(local_10 + 0xb8);
  if (*local_18 == 0) {
    memcpy(__dest,local_6cc,0x74);
  }
  else {
    memcpy(__dest,&local_740,0x74);
  }
  *local_30 = 0;
  iVar1 = SubFrameParamsInit(in_stack_fffffffffffff888,0,0x1a1d63);
  if ((iVar1 == 0) || (iVar1 = SubFrameParamsInit(in_stack_fffffffffffff888,0,0x1a1d79), iVar1 == 0)
     ) {
    return VP8_ENC_ERROR_INVALID_CONFIGURATION;
  }
  memset(local_1e8,0,0x1a0);
  iVar1 = GetSubRects(in_stack_fffffffffffff8b8,
                      (WebPPicture *)
                      CONCAT17(uVar6,CONCAT16(uVar5,CONCAT15(bVar4,in_stack_fffffffffffff8b0))),
                      (int)((ulong)__dest >> 0x20),(int)__dest,in_stack_fffffffffffff8a4,
                      in_stack_fffffffffffff898);
  if (iVar1 == 0) {
    local_38 = VP8_ENC_ERROR_INVALID_CONFIGURATION;
LAB_001a207e:
    for (local_34 = 0; local_34 < 4; local_34 = local_34 + 1) {
      if (aiStack_188[(long)local_34 * 0x1a] != 0) {
        WebPMemoryWriterClear((WebPMemoryWriter *)0x1a20cc);
      }
    }
  }
  else {
    if (((local_1f0 != 0) && (iVar1 = IsEmptyRect(aFStack_428), iVar1 != 0)) ||
       ((local_1f4 != 0 && (iVar1 = IsEmptyRect(aFStack_318), iVar1 != 0)))) {
      *local_30 = 1;
      goto LAB_001a20e3;
    }
    if (local_204 == 0) goto LAB_001a1f8c;
    in_stack_fffffffffffff8b8 = (WebPPicture *)(local_10 + 0x340);
    WebPCopyPixels(in_stack_fffffffffffff890,(WebPPicture *)in_stack_fffffffffffff888);
    DisposeFrameRectangle
              ((int)((ulong)in_stack_fffffffffffff890 >> 0x20),
               (FrameRectangle *)in_stack_fffffffffffff888,(WebPPicture *)0x1a1e8c);
    iVar1 = GetSubRects(in_stack_fffffffffffff8b8,
                        (WebPPicture *)
                        CONCAT17(uVar6,CONCAT16(uVar5,CONCAT15(bVar4,in_stack_fffffffffffff8b0))),
                        (int)((ulong)__dest >> 0x20),(int)__dest,in_stack_fffffffffffff8a4,
                        in_stack_fffffffffffff898);
    if (iVar1 == 0) {
      local_38 = VP8_ENC_ERROR_INVALID_CONFIGURATION;
      goto LAB_001a207e;
    }
    if (*(int *)(local_10 + 0x10) != 0) {
      local_658 = 1;
      local_430 = 1;
      goto LAB_001a1f8c;
    }
    if (local_1ec == 0) {
LAB_001a1f32:
      if (local_1ec == 0) {
        uVar2 = RectArea(aFStack_540);
        uVar3 = RectArea(aFStack_318);
        if (uVar2 < uVar3) goto LAB_001a1f72;
      }
    }
    else {
      uVar2 = RectArea(aFStack_650);
      uVar3 = RectArea(aFStack_428);
      if (uVar3 <= uVar2) goto LAB_001a1f32;
LAB_001a1f72:
      local_658 = 1;
      local_430 = 0;
    }
LAB_001a1f8c:
    if (local_430 != 0) {
      local_38 = GenerateCandidates(in_stack_fffffffffffff908,in_stack_fffffffffffff900,
                                    in_stack_fffffffffffff8fc,in_stack_fffffffffffff8f8,
                                    in_stack_fffffffffffff8f4,in_stack_fffffffffffff8e8,
                                    in_stack_fffffffffffff920,in_stack_fffffffffffff928);
      if (local_38 != VP8_ENC_OK) goto LAB_001a207e;
    }
    if (local_658 != 0) {
      local_38 = GenerateCandidates(in_stack_fffffffffffff908,in_stack_fffffffffffff900,
                                    in_stack_fffffffffffff8fc,in_stack_fffffffffffff8f8,
                                    in_stack_fffffffffffff8f4,in_stack_fffffffffffff8e8,
                                    in_stack_fffffffffffff920,in_stack_fffffffffffff928);
      if (local_38 != VP8_ENC_OK) goto LAB_001a207e;
    }
    PickBestCandidate(in_stack_fffffffffffff8d0,in_stack_fffffffffffff8c8,in_stack_fffffffffffff8c4,
                      (EncodedFrame *)in_stack_fffffffffffff8b8);
  }
LAB_001a20e3:
  SubFrameParamsFree((SubFrameParams *)0x1a20f0);
  SubFrameParamsFree((SubFrameParams *)0x1a20fd);
  return local_38;
}

Assistant:

static int SetFrame(int frame_num, WebPIterator* const iter) {
  const Frame* frame;
  const WebPDemuxer* const dmux = (WebPDemuxer*)iter->private_;
  if (dmux == NULL || frame_num < 0) return 0;
  if (frame_num > dmux->num_frames) return 0;
  if (frame_num == 0) frame_num = dmux->num_frames;

  frame = GetFrame(dmux, frame_num);
  if (frame == NULL) return 0;

  return SynthesizeFrame(dmux, frame, iter);
}